

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O1

ze_result_t
driver::zeFabricEdgeGetVerticesExp
          (ze_fabric_edge_handle_t hEdge,ze_fabric_vertex_handle_t *phVertexA,
          ze_fabric_vertex_handle_t *phVertexB)

{
  ze_result_t zVar1;
  
  if (DAT_0010e720 != (code *)0x0) {
    zVar1 = (*DAT_0010e720)();
    return zVar1;
  }
  context_t::get()::count = (ze_fabric_vertex_handle_t)((long)context_t::get()::count + 1);
  *phVertexA = context_t::get()::count;
  context_t::get()::count = context_t::get()::count + 1;
  *phVertexB = context_t::get()::count;
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFabricEdgeGetVerticesExp(
        ze_fabric_edge_handle_t hEdge,                  ///< [in] handle of the fabric edge instance
        ze_fabric_vertex_handle_t* phVertexA,           ///< [out] fabric vertex connected to one end of the given fabric edge.
        ze_fabric_vertex_handle_t* phVertexB            ///< [out] fabric vertex connected to other end of the given fabric edge.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetVerticesExp = context.zeDdiTable.FabricEdgeExp.pfnGetVerticesExp;
        if( nullptr != pfnGetVerticesExp )
        {
            result = pfnGetVerticesExp( hEdge, phVertexA, phVertexB );
        }
        else
        {
            // generic implementation
            *phVertexA = reinterpret_cast<ze_fabric_vertex_handle_t>( context.get() );

            *phVertexB = reinterpret_cast<ze_fabric_vertex_handle_t>( context.get() );

        }

        return result;
    }